

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O2

void Map_MappingReportChoices(Map_Man_t *pMan)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  Map_Node_t *pMVar6;
  uint uVar7;
  long lVar8;
  
  uVar1 = Map_MappingGetMaxLevel(pMan);
  pMan->nTravIds = pMan->nTravIds + 1;
  for (lVar8 = 0; lVar8 < pMan->nOutputs; lVar8 = lVar8 + 1) {
    Map_MappingUpdateLevel_rec
              (pMan,(Map_Node_t *)((ulong)pMan->pOutputs[lVar8] & 0xfffffffffffffffe),0);
  }
  uVar2 = Map_MappingGetMaxLevel(pMan);
  uVar4 = pMan->vMapObjs->nSize;
  uVar5 = 0;
  uVar3 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar3 = uVar5;
  }
  uVar4 = 0;
  uVar7 = 0;
  for (; uVar5 != uVar3; uVar5 = uVar5 + 1) {
    pMVar6 = pMan->vMapObjs->pArray[uVar5];
    if ((pMVar6->pRepr == (Map_Node_t *)0x0) && (pMVar6->pNextE != (Map_Node_t *)0x0)) {
      for (; pMVar6 != (Map_Node_t *)0x0; pMVar6 = pMVar6->pNextE) {
        uVar4 = uVar4 + 1;
      }
      uVar7 = uVar7 + 1;
    }
  }
  printf("Maximum level: Original = %d. Reduced due to choices = %d.\n",(ulong)uVar1,(ulong)uVar2);
  printf("Choice stats:  Choice nodes = %d. Total choices = %d.\n",(ulong)uVar7,(ulong)uVar4);
  return;
}

Assistant:

void Map_MappingReportChoices( Map_Man_t * pMan )
{
    Map_Node_t * pNode, * pTemp;
    int nChoiceNodes, nChoices;
    int i, LevelMax1, LevelMax2;

    // report the number of levels
    LevelMax1 = Map_MappingGetMaxLevel( pMan );
    pMan->nTravIds++;
    for ( i = 0; i < pMan->nOutputs; i++ )
        Map_MappingUpdateLevel_rec( pMan, Map_Regular(pMan->pOutputs[i]), 0 );
    LevelMax2 = Map_MappingGetMaxLevel( pMan );

    // report statistics about choices
    nChoiceNodes = nChoices = 0;
    for ( i = 0; i < pMan->vMapObjs->nSize; i++ )
    {
        pNode = pMan->vMapObjs->pArray[i];
        if ( pNode->pRepr == NULL && pNode->pNextE != NULL )
        { // this is a choice node = the primary node that has equivalent nodes
            nChoiceNodes++;
            for ( pTemp = pNode; pTemp; pTemp = pTemp->pNextE )
                nChoices++;
        }
    }
    printf( "Maximum level: Original = %d. Reduced due to choices = %d.\n", LevelMax1, LevelMax2 );
    printf( "Choice stats:  Choice nodes = %d. Total choices = %d.\n", nChoiceNodes, nChoices );
}